

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

string * full_ident_name_abi_cxx11_
                   (string *__return_storage_ptr__,vector<Token,_std::allocator<Token>_> *tokens,
                   int begin_index)

{
  int iVar1;
  pointer pTVar2;
  long lVar3;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start[begin_index].u.s,(allocator *)&local_50);
  lVar3 = (ulong)(uint)begin_index * 0x18 + -8;
  do {
    if (begin_index < 1) {
      return __return_storage_ptr__;
    }
    pTVar2 = (tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)pTVar2 + lVar3 + -0x10);
    if (iVar1 == 2) {
      std::__cxx11::string::string
                ((string *)&local_70,*(char **)((long)&pTVar2->type + lVar3),&local_71);
      std::operator+(&local_50,&local_70,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      if ((iVar1 != 0x35) && (iVar1 != 9)) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::insert
                (__return_storage_ptr__,(__return_storage_ptr__->_M_dataplus)._M_p,0x2e);
    }
    begin_index = begin_index + -1;
    lVar3 = lVar3 + -0x18;
  } while( true );
}

Assistant:

string full_ident_name(const std::vector<Token> & tokens, int begin_index)
{
  string res = tokens[begin_index].u.s;
  for (int i = begin_index - 1; i >= 0; i--)
  {
    if (tokens[i].type == TK_DOT || tokens[i].type == TK_NULLGETSTR)
      res.insert(res.begin(), '.');
    else if (tokens[i].type == TK_IDENTIFIER)
      res = string(tokens[i].u.s) + res;
    else
      break;
  }
  return res;
}